

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_DSSS(Context *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = parse_destination_token(ctx,&ctx->dest_arg);
  iVar2 = parse_source_token(ctx,ctx->source_args);
  iVar3 = parse_source_token(ctx,ctx->source_args + 1);
  iVar4 = parse_source_token(ctx,ctx->source_args + 2);
  return iVar4 + iVar3 + iVar2 + iVar1 + 1;
}

Assistant:

static int parse_args_DSSS(Context *ctx)
{
    int retval = 1;
    retval += parse_destination_token(ctx, &ctx->dest_arg);
    retval += parse_source_token(ctx, &ctx->source_args[0]);
    retval += parse_source_token(ctx, &ctx->source_args[1]);
    retval += parse_source_token(ctx, &ctx->source_args[2]);
    return retval;
}